

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variables.cpp
# Opt level: O2

void __thiscall
Refal2::CVariablesBuilder::warningObsoleteVariableType
          (CVariablesBuilder *this,char type,char *replacement)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_b8,'\x01');
  std::operator+(&local_98,"variable type `",&local_b8);
  std::operator+(&local_78,&local_98,"` is obsolete, use `");
  std::operator+(&local_58,&local_78,replacement);
  std::operator+(&local_38,&local_58,"` istead it");
  CErrorsHelper::RaiseError(&this->super_CErrorsHelper,ES_Warning,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  return;
}

Assistant:

void CVariablesBuilder::warningObsoleteVariableType( char type,
	const char* replacement )
{
	CErrorsHelper::RaiseError( ES_Warning,
		"variable type `" + std::string( 1, type ) + "` is obsolete, use `"
		+ replacement + "` istead it" );
}